

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.hpp
# Opt level: O1

void __thiscall nite::Console::Result::Result(Result *this)

{
  Color *this_00;
  Color local_30;
  
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  this_00 = &this->color;
  Color::Color(this_00);
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)(this->msg)._M_string_length,0x247da9);
  Color::Color(&local_30,1.0,1.0,1.0,1.0);
  this_00->r = local_30.r;
  this_00->g = local_30.g;
  (this->color).b = local_30.b;
  (this->color).a = local_30.a;
  this->val = 0;
  return;
}

Assistant:

Result(){
                    msg = "";
                    color = nite::Color(1.0f, 1.0f, 1.0f, 1.0f);
                    val = 0;
                }